

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O3

global_object_create_result *
mjs::make_array_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  int iVar1;
  long *plVar2;
  function_object *pfVar3;
  void *pvVar4;
  long *plVar5;
  gc_heap_ptr<mjs::function_object> o_1;
  gc_heap_ptr<mjs::gc_function> p_1;
  gc_heap_ptr<mjs::function_object> o;
  gc_heap_ptr<mjs::gc_function> p;
  gc_heap_ptr<mjs::gc_function> p_3;
  gc_heap_ptr<mjs::array_object> prototype;
  gc_heap_ptr<mjs::function_object> c;
  string Array_str_;
  gc_heap_ptr_untyped local_110;
  gc_heap_ptr_untyped local_100;
  undefined1 local_f0 [16];
  gc_heap_ptr_untyped local_e0;
  gc_heap_ptr_untyped local_d0;
  undefined1 local_c0 [40];
  undefined1 local_98 [8];
  gc_heap_ptr_untyped local_90;
  string_view local_80;
  gc_heap_ptr_untyped local_70;
  string_view local_60;
  gc_heap_ptr_untyped local_50;
  gc_heap_ptr_untyped local_40;
  
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x98))(&local_40,plVar2,"Array");
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x58))(local_c0,plVar2);
  local_98 = (undefined1  [8])((ulong)(uint)local_98._4_4_ << 0x20);
  gc_heap::
  allocate_and_construct<mjs::array_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::string_const&,mjs::gc_heap_ptr<mjs::object>const&,unsigned_int&>
            ((gc_heap *)&local_70,(size_t)local_40.heap_,(gc_heap_ptr<mjs::global_object> *)0x30,
             (string *)global,(gc_heap_ptr<mjs::object> *)&local_40,(uint *)local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
  local_f0._0_8_ = (global->super_gc_heap_ptr_untyped).heap_;
  local_f0._8_4_ = (global->super_gc_heap_ptr_untyped).pos_;
  if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)local_f0);
  }
  make_raw_function((mjs *)&local_50,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_50);
  local_98 = (undefined1  [8])0x0;
  local_90.heap_ = (gc_heap *)((ulong)local_90.heap_._4_4_ << 0x20);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_c0,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4338;
  *(undefined8 *)((long)pvVar4 + 0x10) = local_f0._0_8_;
  *(undefined4 *)((long)pvVar4 + 0x18) = local_f0._8_4_;
  if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
  }
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_c0,
             (gc_heap_ptr<mjs::gc_string> *)&local_40,(gc_heap_ptr<mjs::gc_string> *)local_98,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_50);
  function_object::default_construct_function(pfVar3);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&local_70);
  plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar5 + 0x98))(local_98,plVar5,"constructor");
  local_f0._0_8_ = local_50.heap_;
  local_f0._8_4_ = local_50.pos_;
  if (local_50.heap_ == (gc_heap *)0x0) {
    local_c0._0_4_ = object;
    local_c0._8_8_ = (gc_heap *)0x0;
    local_c0._16_4_ = local_50.pos_;
  }
  else {
    gc_heap::attach(local_50.heap_,(gc_heap_ptr_untyped *)local_f0);
    local_c0._0_4_ = object;
    local_c0._8_8_ = local_f0._0_8_;
    local_c0._16_4_ = local_f0._8_4_;
    if ((gc_heap *)local_f0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_f0._0_8_,(gc_heap_ptr_untyped *)(local_c0 + 8));
    }
  }
  (**(code **)(*plVar2 + 8))(plVar2,local_98,local_c0,2);
  value::destroy((value *)local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  iVar1 = *(int *)((long)pvVar4 + 0x20);
  if (iVar1 < 1) {
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 8;
    local_60._M_str = "toString";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4378;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
  }
  else {
    local_d0.heap_ = local_70.heap_;
    local_d0.pos_ = local_70.pos_;
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,&local_d0);
    }
    local_98._0_4_ = iVar1;
    local_90.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_90.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_90.heap_,&local_90);
    local_80._M_len = 8;
    local_80._M_str = "toString";
    string::string((string *)&local_60,(global->super_gc_heap_ptr_untyped).heap_,&local_80);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_d0);
    make_raw_function((mjs *)(local_f0 + 0x10),global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    local_100.heap_ = (gc_heap *)0x0;
    local_100.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_f0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d43b8;
    *(undefined4 *)((long)pvVar4 + 0x10) = local_98._0_4_;
    *(gc_heap **)((long)pvVar4 + 0x18) = local_90.heap_;
    *(uint32_t *)((long)pvVar4 + 0x20) = local_90.pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x18));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_f0,
               (gc_heap_ptr<mjs::gc_string> *)&local_60,(gc_heap_ptr<mjs::gc_string> *)&local_100,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    local_110.heap_ = local_e0.heap_;
    local_110.pos_ = local_e0.pos_;
    if ((slot *)local_e0.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_e0.pos_;
    }
    else {
      gc_heap::attach(local_e0.heap_,&local_110);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_110.heap_;
      local_c0._16_4_ = local_110.pos_;
      if ((slot *)local_110.heap_ != (slot *)0x0) {
        gc_heap::attach(local_110.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_60,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_60);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    local_d0.heap_ = local_70.heap_;
    local_d0.pos_ = local_70.pos_;
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,&local_d0);
    }
    local_98._0_4_ = iVar1;
    local_90.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_90.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_90.heap_,&local_90);
    local_80._M_len = 0xe;
    local_80._M_str = "toLocaleString";
    string::string((string *)&local_60,(global->super_gc_heap_ptr_untyped).heap_,&local_80);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_d0);
    make_raw_function((mjs *)(local_f0 + 0x10),global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    local_100.heap_ = (gc_heap *)0x0;
    local_100.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_f0,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d43f8;
    *(undefined4 *)((long)pvVar4 + 0x10) = local_98._0_4_;
    *(gc_heap **)((long)pvVar4 + 0x18) = local_90.heap_;
    *(uint32_t *)((long)pvVar4 + 0x20) = local_90.pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x18));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_f0,
               (gc_heap_ptr<mjs::gc_string> *)&local_60,(gc_heap_ptr<mjs::gc_string> *)&local_100,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    local_110.heap_ = local_e0.heap_;
    local_110.pos_ = local_e0.pos_;
    if ((slot *)local_e0.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_e0.pos_;
    }
    else {
      gc_heap::attach(local_e0.heap_,&local_110);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_110.heap_;
      local_c0._16_4_ = local_110.pos_;
      if ((slot *)local_110.heap_ != (slot *)0x0) {
        gc_heap::attach(local_110.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_60,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_60);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 6;
    local_60._M_str = "concat";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4438;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 3;
    local_60._M_str = "pop";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4478;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 4;
    local_60._M_str = "push";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d44b8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 5;
    local_60._M_str = "shift";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d44f8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 7;
    local_60._M_str = "unshift";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4538;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 5;
    local_60._M_str = "slice";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4578;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 6;
    local_60._M_str = "splice";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d45b8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
  local_80._M_len = (size_t)local_70.heap_;
  local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
  if (local_70.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
  }
  local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
  local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
  gc_heap::attach(local_d0.heap_,&local_d0);
  local_60._M_len = 4;
  local_60._M_str = "join";
  string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
  make_raw_function((mjs *)&local_110,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
  local_f0._0_8_ = (gc_heap *)0x0;
  local_f0._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d45f8;
  *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
  *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
  if (local_d0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
  }
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
             (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_100.heap_ = local_110.heap_;
  local_100.pos_ = local_110.pos_;
  if ((slot *)local_110.heap_ == (slot *)0x0) {
    local_c0._0_4_ = object;
    local_c0._8_8_ = (gc_heap *)0x0;
    local_c0._16_4_ = local_110.pos_;
  }
  else {
    gc_heap::attach(local_110.heap_,&local_100);
    local_c0._0_4_ = object;
    local_c0._8_8_ = local_100.heap_;
    local_c0._16_4_ = local_100.pos_;
    if ((slot *)local_100.heap_ != (slot *)0x0) {
      gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
    }
  }
  (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
  value::destroy((value *)local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
  local_80._M_len = (size_t)local_70.heap_;
  local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
  if (local_70.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
  }
  local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
  local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
  gc_heap::attach(local_d0.heap_,&local_d0);
  local_60._M_len = 7;
  local_60._M_str = "reverse";
  string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
  make_raw_function((mjs *)&local_110,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
  local_f0._0_8_ = (gc_heap *)0x0;
  local_f0._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4638;
  *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
  *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
  if (local_d0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
  }
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
             (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)local_f0,0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_100.heap_ = local_110.heap_;
  local_100.pos_ = local_110.pos_;
  if ((slot *)local_110.heap_ == (slot *)0x0) {
    local_c0._0_4_ = object;
    local_c0._8_8_ = (gc_heap *)0x0;
    local_c0._16_4_ = local_110.pos_;
  }
  else {
    gc_heap::attach(local_110.heap_,&local_100);
    local_c0._0_4_ = object;
    local_c0._8_8_ = local_100.heap_;
    local_c0._16_4_ = local_100.pos_;
    if ((slot *)local_100.heap_ != (slot *)0x0) {
      gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
    }
  }
  (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
  value::destroy((value *)local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
  local_80._M_len = (size_t)local_70.heap_;
  local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
  if (local_70.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
  }
  local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
  local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
  gc_heap::attach(local_d0.heap_,&local_d0);
  local_60._M_len = 4;
  local_60._M_str = "sort";
  string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
  make_raw_function((mjs *)&local_110,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
  local_f0._0_8_ = (gc_heap *)0x0;
  local_f0._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4678;
  *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
  *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
  if (local_d0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
  }
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
             (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
             (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_100.heap_ = local_110.heap_;
  local_100.pos_ = local_110.pos_;
  if ((slot *)local_110.heap_ == (slot *)0x0) {
    local_c0._0_4_ = object;
    local_c0._8_8_ = (gc_heap *)0x0;
    local_c0._16_4_ = local_110.pos_;
  }
  else {
    gc_heap::attach(local_110.heap_,&local_100);
    local_c0._0_4_ = object;
    local_c0._8_8_ = local_100.heap_;
    local_c0._16_4_ = local_100.pos_;
    if ((slot *)local_100.heap_ != (slot *)0x0) {
      gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
    }
  }
  (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
  value::destroy((value *)local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
  if (1 < iVar1) {
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 7;
    local_60._M_str = "indexOf";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d46b8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 0xb;
    local_60._M_str = "lastIndexOf";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d46f8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 5;
    local_60._M_str = "every";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4738;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 4;
    local_60._M_str = "some";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4778;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 7;
    local_60._M_str = "forEach";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d47b8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 3;
    local_60._M_str = "map";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d47f8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 6;
    local_60._M_str = "filter";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4838;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 6;
    local_60._M_str = "reduce";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d4878;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_70.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_70.pos_);
    if (local_70.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_70.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 0xb;
    local_60._M_str = "reduceRight";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d48b8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
    local_80._M_len = (size_t)local_50.heap_;
    local_80._M_str = (char *)CONCAT44(local_80._M_str._4_4_,local_50.pos_);
    if (local_50.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_50.heap_,(gc_heap_ptr_untyped *)&local_80);
    }
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    gc_heap::attach(local_d0.heap_,&local_d0);
    local_60._M_len = 7;
    local_60._M_str = "isArray";
    string::string((string *)(local_f0 + 0x10),(global->super_gc_heap_ptr_untyped).heap_,&local_60);
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_80);
    make_raw_function((mjs *)&local_110,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_110);
    local_f0._0_8_ = (gc_heap *)0x0;
    local_f0._8_4_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001d48f8;
    *(gc_heap **)((long)pvVar4 + 0x10) = local_d0.heap_;
    *(uint32_t *)((long)pvVar4 + 0x18) = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)(local_f0 + 0x10),
               (gc_heap_ptr<mjs::gc_string> *)local_f0,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_100.heap_ = local_110.heap_;
    local_100.pos_ = local_110.pos_;
    if ((slot *)local_110.heap_ == (slot *)0x0) {
      local_c0._0_4_ = object;
      local_c0._8_8_ = (gc_heap *)0x0;
      local_c0._16_4_ = local_110.pos_;
    }
    else {
      gc_heap::attach(local_110.heap_,&local_100);
      local_c0._0_4_ = object;
      local_c0._8_8_ = local_100.heap_;
      local_c0._16_4_ = local_100.pos_;
      if ((slot *)local_100.heap_ != (slot *)0x0) {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)(local_c0 + 8));
      }
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_f0 + 0x10,local_c0,2);
    value::destroy((value *)local_c0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_f0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
  }
  (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.heap_ = local_50.heap_;
  (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.pos_ = local_50.pos_;
  if (local_50.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_50.heap_,(gc_heap_ptr_untyped *)__return_storage_ptr__);
  }
  (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.heap_ = local_70.heap_;
  (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.pos_ = local_70.pos_;
  if (local_70.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_70.heap_,&(__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_array_object(const gc_heap_ptr<global_object>& global) {
    auto Array_str_ = global->common_string("Array");
    auto prototype = array_object::make(global, Array_str_, global->object_prototype(), 0);

    auto c = make_function(global, [global](const value&, const std::vector<value>& args) {
        return value{make_array(global, args)};
    }, Array_str_.unsafe_raw_get(), 1);
    c->default_construct_function();

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    const auto version = global->language_version();

    if (version < version::es3) {
        put_native_function(global, prototype, "toString", [global = global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return value{array_join(this_.object_value(), L",")};
        }, 0);
    } else {
        put_native_function(global, prototype, "toString", [version, global = global](const value& this_, const std::vector<value>&) {
            if (version < version::es5) global->validate_type(this_, global->array_prototype(), "array");
            return value{array_join(this_.object_value(), L",")};
        }, 0);
        put_native_function(global, prototype, "toLocaleString", [version, global = global](const value& this_, const std::vector<value>&) {
            if (version < version::es5) global->validate_type(this_, global->array_prototype(), "array");
            return value{array_to_locale_string(global, this_.object_value())};
        }, 0);
        put_native_function(global, prototype, "concat", [global](const value& this_, const std::vector<value>& args) {
            return array_concat(global, this_, args);
        }, 1);
        put_native_function(global, prototype, "pop", [global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return array_pop(global, this_.object_value());
        }, 0);
        put_native_function(global, prototype, "push", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_push(global, this_.object_value(), args);
        }, 1);
        put_native_function(global, prototype, "shift", [global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return array_shift(global, this_.object_value());
        }, 0);
        put_native_function(global, prototype, "unshift", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_unshift(global, this_.object_value(), args);
        }, 1);
        put_native_function(global, prototype, "slice", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_slice(global, this_.object_value(), args);
        }, 2);
        put_native_function(global, prototype, "splice", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_splice(global, this_.object_value(), args);
        }, 2);
    }
    put_native_function(global, prototype, "join", [global](const value& this_, const std::vector<value>& args) {
        global->validate_object(this_);
        auto& h = global.heap();
        return value{array_join(this_.object_value(), !args.empty() ? to_string(h, args.front()).view() : std::wstring_view{L","})};
    }, 1);
    put_native_function(global, prototype, "reverse", [global](const value& this_, const std::vector<value>&) {
        global->validate_object(this_);
        const auto& o = this_.object_value();
        const uint32_t length = to_uint32(o->get(L"length"));
        auto& h = global.heap();
        for (uint32_t k = 0; k != length / 2; ++k) {
            const auto i1 = index_string(k);
            const auto i2 = index_string(length - k - 1);
            auto v1 = o->get(i1);
            auto v2 = o->get(i2);
            o->put(string{h, i1}, v2);
            o->put(string{h, i2}, v1);
        }
        return this_;
    }, 0);
    put_native_function(global, prototype, "sort", [global](const value& this_, const std::vector<value>& args) {
        global->validate_object(this_);
        const auto& o = *this_.object_value();
        auto& h = o.heap(); // Capture heap reference (which continues to be valid even after GC) since `this` can move when calling a user-defined compare function (since this can cause GC)
        const uint32_t length = to_uint32(o.get(L"length"));

        value comparefn = !args.empty() ? args.front() : value::undefined;

        auto sort_compare = [comparefn, &h](const value& x, const value& y) {
            if (x.type() == value_type::undefined && y.type() == value_type::undefined) {
                return 0;
            } else if (x.type() == value_type::undefined) {
                return 1;
            } else if (y.type() == value_type::undefined) {
                return -1;
            }
            if (comparefn.type() != value_type::undefined) {
                const auto r = to_number(call_function(comparefn, value::null, {x,y}));
                if (r < 0) return -1;
                if (r > 0) return 1;
                return 0;
            } else {
                const auto xs = to_string(h, x);
                const auto ys = to_string(h, y);
                if (xs.view() < ys.view()) return -1;
                if (xs.view() > ys.view()) return 1;
                return 0;
            }
        };

        std::vector<value> values(length);
        for (uint32_t i = 0; i < length; ++i) {
            values[i] = o.get(index_string(i));
        }
        std::stable_sort(values.begin(), values.end(), [&](const value& x, const value& y) {
            return sort_compare(x, y) < 0;
        });
        // Note: `this` has possibly become invalid here (!)
        auto& o_after = *this_.object_value(); // Recapture object reference (since it could also have moved)
        for (uint32_t i = 0; i < length; ++i) {
            o_after.put(string{h, index_string(i)}, values[i]);
        }
        return this_;
    }, 1);


    if (version >= version::es5) {
        put_native_function(global, prototype, "indexOf", [global](const value& this_, const std::vector<value>& args) {
            return value{array_index_of(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "lastIndexOf", [global](const value& this_, const std::vector<value>& args) {
            return value{array_last_index_of(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "every", [global](const value& this_, const std::vector<value>& args) {
            return value{array_every(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "some", [global](const value& this_, const std::vector<value>& args) {
            return value{array_some(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "forEach", [global](const value& this_, const std::vector<value>& args) {
            array_for_each(global, this_, args);
            return value::undefined;
        }, 1);

        put_native_function(global, prototype, "map", [global](const value& this_, const std::vector<value>& args) {
            return value{array_map(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "filter", [global](const value& this_, const std::vector<value>& args) {
            return value{array_filter(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "reduce", [global](const value& this_, const std::vector<value>& args) {
            return value{array_reduce(global, this_, args, false)};
        }, 1);

        put_native_function(global, prototype, "reduceRight", [global](const value& this_, const std::vector<value>& args) {
            return value{array_reduce(global, this_, args, true)};
        }, 1);

        put_native_function(global, c, "isArray", [global](const value&, const std::vector<value>& args) {
            return value{!args.empty() && args.front().type() == value_type::object && is_array(args.front().object_value())};
        }, 1);
    }

    return { c, prototype };
}